

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize.h
# Opt level: O1

void stbir__encode_scanline
               (stbir__info *stbir_info,int num_pixels,void *output_buffer,float *encode_buffer,
               int channels,int alpha_channel,int decode)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  float fVar8;
  float fVar9;
  stbir_uint16 nonalpha [64];
  ushort auStack_b8 [68];
  
  uVar1 = stbir_info->flags;
  if (0 < num_pixels && (uVar1 & 1) == 0) {
    uVar7 = 0;
    uVar5 = 0;
    do {
      if (0 < channels) {
        fVar8 = encode_buffer[(long)alpha_channel + uVar5 * (long)channels];
        uVar3 = 0;
        do {
          if ((uint)alpha_channel != uVar3) {
            encode_buffer[uVar7 + uVar3] =
                 encode_buffer[uVar7 + uVar3] * (float)(-(uint)(fVar8 != 0.0) & (uint)(1.0 / fVar8))
            ;
          }
          uVar3 = uVar3 + 1;
        } while ((uint)channels != uVar3);
      }
      uVar5 = uVar5 + 1;
      uVar7 = (ulong)(uint)((int)uVar7 + channels);
    } while (uVar5 != (uint)num_pixels);
  }
  if (channels < 1) {
    uVar5 = 0;
  }
  else {
    iVar2 = 0;
    uVar5 = 0;
    do {
      if (alpha_channel != iVar2 || (uVar1 & 2) != 0) {
        iVar4 = (int)uVar5;
        uVar5 = (ulong)(iVar4 + 1);
        auStack_b8[iVar4] = (ushort)iVar2;
      }
      iVar2 = iVar2 + 1;
    } while (channels != iVar2);
  }
  iVar2 = (int)uVar5;
  switch(decode) {
  case 0:
    if (0 < num_pixels) {
      uVar5 = 0;
      uVar7 = 0;
      do {
        if (0 < channels) {
          uVar3 = 0;
          do {
            fVar8 = encode_buffer[uVar5 + uVar3];
            fVar9 = 1.0;
            if (fVar8 <= 1.0) {
              fVar9 = fVar8;
            }
            *(char *)((long)output_buffer + uVar3 + uVar5) =
                 (char)(int)((float)(~-(uint)(fVar8 < 0.0) & (uint)(fVar9 * 255.0)) + 0.5);
            uVar3 = uVar3 + 1;
          } while ((uint)channels != uVar3);
        }
        uVar7 = uVar7 + 1;
        uVar5 = (ulong)(uint)((int)uVar5 + channels);
      } while (uVar7 != (uint)num_pixels);
    }
    break;
  case 1:
    if (0 < num_pixels) {
      uVar7 = 0;
      do {
        if (0 < iVar2) {
          uVar3 = 0;
          do {
            lVar6 = (ulong)auStack_b8[uVar3] + uVar7 * (long)channels;
            fVar8 = encode_buffer[lVar6];
            if (fVar8 <= 0.00012207031) {
              fVar8 = 0.00012207031;
            }
            fVar9 = 0.99999994;
            if (fVar8 <= 0.99999994) {
              fVar9 = fVar8;
            }
            *(char *)((long)output_buffer + lVar6) =
                 (char)(((uint)fVar9 >> 0xc & 0xff) *
                        (fp32_to_srgb8_tab4[(int)fVar9 + 0xc7000000U >> 0x14] & 0xffff) +
                        (fp32_to_srgb8_tab4[(int)fVar9 + 0xc7000000U >> 0x14] >> 7 & 0xfffe00) >>
                       0x10);
            uVar3 = uVar3 + 1;
          } while (uVar5 != uVar3);
        }
        if ((stbir_info->flags & 2) == 0) {
          lVar6 = uVar7 * (long)channels + (long)alpha_channel;
          fVar8 = encode_buffer[lVar6];
          fVar9 = 1.0;
          if (fVar8 <= 1.0) {
            fVar9 = fVar8;
          }
          *(char *)((long)output_buffer + lVar6) =
               (char)(int)((float)(~-(uint)(fVar8 < 0.0) & (uint)(fVar9 * 255.0)) + 0.5);
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 != (uint)num_pixels);
    }
    break;
  case 2:
    if (0 < num_pixels) {
      uVar5 = 0;
      uVar7 = 0;
      do {
        if (0 < channels) {
          uVar3 = 0;
          do {
            fVar8 = encode_buffer[uVar5 + uVar3];
            fVar9 = 1.0;
            if (fVar8 <= 1.0) {
              fVar9 = fVar8;
            }
            *(short *)((long)output_buffer + uVar3 * 2 + uVar5 * 2) =
                 (short)(int)((float)(~-(uint)(fVar8 < 0.0) & (uint)(fVar9 * 65535.0)) + 0.5);
            uVar3 = uVar3 + 1;
          } while ((uint)channels != uVar3);
        }
        uVar7 = uVar7 + 1;
        uVar5 = (ulong)(uint)((int)uVar5 + channels);
      } while (uVar7 != (uint)num_pixels);
    }
    break;
  case 3:
    if (0 < num_pixels) {
      uVar7 = 0;
      do {
        if (0 < iVar2) {
          uVar3 = 0;
          do {
            lVar6 = (ulong)auStack_b8[uVar3] + uVar7 * (long)channels;
            fVar8 = encode_buffer[lVar6];
            fVar9 = 1.0;
            if (fVar8 <= 1.0) {
              fVar9 = fVar8;
            }
            fVar9 = (float)(~-(uint)(fVar8 < 0.0) & (uint)fVar9);
            if (fVar9 <= 0.0031308) {
              fVar9 = fVar9 * 12.92;
            }
            else {
              fVar8 = powf(fVar9,0.41666666);
              fVar9 = fVar8 * 1.055 + -0.055;
            }
            *(short *)((long)output_buffer + lVar6 * 2) = (short)(int)(fVar9 * 65535.0 + 0.5);
            uVar3 = uVar3 + 1;
          } while (uVar5 != uVar3);
        }
        if ((stbir_info->flags & 2) == 0) {
          lVar6 = uVar7 * (long)channels + (long)alpha_channel;
          fVar8 = encode_buffer[lVar6];
          fVar9 = 1.0;
          if (fVar8 <= 1.0) {
            fVar9 = fVar8;
          }
          *(short *)((long)output_buffer + lVar6 * 2) =
               (short)(int)((float)(~-(uint)(fVar8 < 0.0) & (uint)(fVar9 * 65535.0)) + 0.5);
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 != (uint)num_pixels);
    }
    break;
  case 4:
    if (0 < num_pixels) {
      uVar5 = 0;
      uVar7 = 0;
      do {
        if (0 < channels) {
          uVar3 = 0;
          do {
            fVar8 = encode_buffer[uVar5 + uVar3];
            fVar9 = 1.0;
            if (fVar8 <= 1.0) {
              fVar9 = fVar8;
            }
            *(int *)((long)output_buffer + uVar3 * 4 + uVar5 * 4) =
                 (int)(long)((float)(~-(uint)(fVar8 < 0.0) & (uint)fVar9) * 4.2949673e+09 + 0.5);
            uVar3 = uVar3 + 1;
          } while ((uint)channels != uVar3);
        }
        uVar7 = uVar7 + 1;
        uVar5 = (ulong)(uint)((int)uVar5 + channels);
      } while (uVar7 != (uint)num_pixels);
    }
    break;
  case 5:
    if (0 < num_pixels) {
      uVar7 = 0;
      do {
        if (0 < iVar2) {
          uVar3 = 0;
          do {
            lVar6 = (ulong)auStack_b8[uVar3] + uVar7 * (long)channels;
            fVar8 = encode_buffer[lVar6];
            fVar9 = 1.0;
            if (fVar8 <= 1.0) {
              fVar9 = fVar8;
            }
            fVar9 = (float)(~-(uint)(fVar8 < 0.0) & (uint)fVar9);
            if (fVar9 <= 0.0031308) {
              fVar9 = fVar9 * 12.92;
            }
            else {
              fVar8 = powf(fVar9,0.41666666);
              fVar9 = fVar8 * 1.055 + -0.055;
            }
            *(int *)((long)output_buffer + lVar6 * 4) = (int)(long)(fVar9 * 4.2949673e+09 + 0.5);
            uVar3 = uVar3 + 1;
          } while (uVar5 != uVar3);
        }
        if ((stbir_info->flags & 2) == 0) {
          lVar6 = uVar7 * (long)channels + (long)alpha_channel;
          fVar8 = encode_buffer[lVar6];
          fVar9 = 1.0;
          if (fVar8 <= 1.0) {
            fVar9 = fVar8;
          }
          *(int *)((long)output_buffer + lVar6 * 4) =
               (int)((float)(~-(uint)(fVar8 < 0.0) & (uint)fVar9) * 4.2949673e+09 + 0.5);
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 != (uint)num_pixels);
    }
    break;
  case 6:
    if (0 < num_pixels) {
      uVar5 = 0;
      uVar7 = 0;
      do {
        if (0 < channels) {
          uVar3 = 0;
          do {
            *(float *)((long)output_buffer + uVar3 * 4 + uVar5 * 4) = encode_buffer[uVar5 + uVar3];
            uVar3 = uVar3 + 1;
          } while ((uint)channels != uVar3);
        }
        uVar7 = uVar7 + 1;
        uVar5 = (ulong)(uint)((int)uVar5 + channels);
      } while (uVar7 != (uint)num_pixels);
    }
    break;
  case 7:
    if (0 < num_pixels) {
      uVar7 = 0;
      do {
        if (0 < iVar2) {
          uVar3 = 0;
          do {
            lVar6 = (ulong)auStack_b8[uVar3] + uVar7 * (long)channels;
            fVar8 = encode_buffer[lVar6];
            if (fVar8 <= 0.0031308) {
              fVar8 = fVar8 * 12.92;
            }
            else {
              fVar8 = powf(fVar8,0.41666666);
              fVar8 = fVar8 * 1.055 + -0.055;
            }
            *(float *)((long)output_buffer + lVar6 * 4) = fVar8;
            uVar3 = uVar3 + 1;
          } while (uVar5 != uVar3);
        }
        if ((stbir_info->flags & 2) == 0) {
          lVar6 = uVar7 * (long)channels + (long)alpha_channel;
          *(float *)((long)output_buffer + lVar6 * 4) = encode_buffer[lVar6];
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 != (uint)num_pixels);
    }
    break;
  default:
    __assert_fail("!\"Unknown type/colorspace/channels combination.\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dkubek[P]NPRG041-image_match/extern/stb/stb_image_resize.h"
                  ,0x746,
                  "void stbir__encode_scanline(stbir__info *, int, void *, float *, int, int, int)")
    ;
  }
  return;
}

Assistant:

static void stbir__encode_scanline(stbir__info* stbir_info, int num_pixels, void *output_buffer, float *encode_buffer, int channels, int alpha_channel, int decode)
{
    int x;
    int n;
    int num_nonalpha;
    stbir_uint16 nonalpha[STBIR_MAX_CHANNELS];

    if (!(stbir_info->flags&STBIR_FLAG_ALPHA_PREMULTIPLIED))
    {
        for (x=0; x < num_pixels; ++x)
        {
            int pixel_index = x*channels;

            float alpha = encode_buffer[pixel_index + alpha_channel];
            float reciprocal_alpha = alpha ? 1.0f / alpha : 0;

            // unrolling this produced a 1% slowdown upscaling a large RGBA linear-space image on my machine - stb
            for (n = 0; n < channels; n++)
                if (n != alpha_channel)
                    encode_buffer[pixel_index + n] *= reciprocal_alpha;

            // We added in a small epsilon to prevent the color channel from being deleted with zero alpha.
            // Because we only add it for integer types, it will automatically be discarded on integer
            // conversion, so we don't need to subtract it back out (which would be problematic for
            // numeric precision reasons).
        }
    }

    // build a table of all channels that need colorspace correction, so
    // we don't perform colorspace correction on channels that don't need it.
    for (x = 0, num_nonalpha = 0; x < channels; ++x)
    {
        if (x != alpha_channel || (stbir_info->flags & STBIR_FLAG_ALPHA_USES_COLORSPACE))
        {
            nonalpha[num_nonalpha++] = (stbir_uint16)x;
        }
    }

    #define STBIR__ROUND_INT(f)    ((int)          ((f)+0.5))
    #define STBIR__ROUND_UINT(f)   ((stbir_uint32) ((f)+0.5))

    #ifdef STBIR__SATURATE_INT
    #define STBIR__ENCODE_LINEAR8(f)   stbir__saturate8 (STBIR__ROUND_INT((f) * stbir__max_uint8_as_float ))
    #define STBIR__ENCODE_LINEAR16(f)  stbir__saturate16(STBIR__ROUND_INT((f) * stbir__max_uint16_as_float))
    #else
    #define STBIR__ENCODE_LINEAR8(f)   (unsigned char ) STBIR__ROUND_INT(stbir__saturate(f) * stbir__max_uint8_as_float )
    #define STBIR__ENCODE_LINEAR16(f)  (unsigned short) STBIR__ROUND_INT(stbir__saturate(f) * stbir__max_uint16_as_float)
    #endif

    switch (decode)
    {
        case STBIR__DECODE(STBIR_TYPE_UINT8, STBIR_COLORSPACE_LINEAR):
            for (x=0; x < num_pixels; ++x)
            {
                int pixel_index = x*channels;

                for (n = 0; n < channels; n++)
                {
                    int index = pixel_index + n;
                    ((unsigned char*)output_buffer)[index] = STBIR__ENCODE_LINEAR8(encode_buffer[index]);
                }
            }
            break;

        case STBIR__DECODE(STBIR_TYPE_UINT8, STBIR_COLORSPACE_SRGB):
            for (x=0; x < num_pixels; ++x)
            {
                int pixel_index = x*channels;

                for (n = 0; n < num_nonalpha; n++)
                {
                    int index = pixel_index + nonalpha[n];
                    ((unsigned char*)output_buffer)[index] = stbir__linear_to_srgb_uchar(encode_buffer[index]);
                }

                if (!(stbir_info->flags & STBIR_FLAG_ALPHA_USES_COLORSPACE))
                    ((unsigned char *)output_buffer)[pixel_index + alpha_channel] = STBIR__ENCODE_LINEAR8(encode_buffer[pixel_index+alpha_channel]);
            }
            break;

        case STBIR__DECODE(STBIR_TYPE_UINT16, STBIR_COLORSPACE_LINEAR):
            for (x=0; x < num_pixels; ++x)
            {
                int pixel_index = x*channels;

                for (n = 0; n < channels; n++)
                {
                    int index = pixel_index + n;
                    ((unsigned short*)output_buffer)[index] = STBIR__ENCODE_LINEAR16(encode_buffer[index]);
                }
            }
            break;

        case STBIR__DECODE(STBIR_TYPE_UINT16, STBIR_COLORSPACE_SRGB):
            for (x=0; x < num_pixels; ++x)
            {
                int pixel_index = x*channels;

                for (n = 0; n < num_nonalpha; n++)
                {
                    int index = pixel_index + nonalpha[n];
                    ((unsigned short*)output_buffer)[index] = (unsigned short)STBIR__ROUND_INT(stbir__linear_to_srgb(stbir__saturate(encode_buffer[index])) * stbir__max_uint16_as_float);
                }

                if (!(stbir_info->flags&STBIR_FLAG_ALPHA_USES_COLORSPACE))
                    ((unsigned short*)output_buffer)[pixel_index + alpha_channel] = STBIR__ENCODE_LINEAR16(encode_buffer[pixel_index + alpha_channel]);
            }

            break;

        case STBIR__DECODE(STBIR_TYPE_UINT32, STBIR_COLORSPACE_LINEAR):
            for (x=0; x < num_pixels; ++x)
            {
                int pixel_index = x*channels;

                for (n = 0; n < channels; n++)
                {
                    int index = pixel_index + n;
                    ((unsigned int*)output_buffer)[index] = (unsigned int)STBIR__ROUND_UINT(((double)stbir__saturate(encode_buffer[index])) * stbir__max_uint32_as_float);
                }
            }
            break;

        case STBIR__DECODE(STBIR_TYPE_UINT32, STBIR_COLORSPACE_SRGB):
            for (x=0; x < num_pixels; ++x)
            {
                int pixel_index = x*channels;

                for (n = 0; n < num_nonalpha; n++)
                {
                    int index = pixel_index + nonalpha[n];
                    ((unsigned int*)output_buffer)[index] = (unsigned int)STBIR__ROUND_UINT(((double)stbir__linear_to_srgb(stbir__saturate(encode_buffer[index]))) * stbir__max_uint32_as_float);
                }

                if (!(stbir_info->flags&STBIR_FLAG_ALPHA_USES_COLORSPACE))
                    ((unsigned int*)output_buffer)[pixel_index + alpha_channel] = (unsigned int)STBIR__ROUND_INT(((double)stbir__saturate(encode_buffer[pixel_index + alpha_channel])) * stbir__max_uint32_as_float);
            }
            break;

        case STBIR__DECODE(STBIR_TYPE_FLOAT, STBIR_COLORSPACE_LINEAR):
            for (x=0; x < num_pixels; ++x)
            {
                int pixel_index = x*channels;

                for (n = 0; n < channels; n++)
                {
                    int index = pixel_index + n;
                    ((float*)output_buffer)[index] = encode_buffer[index];
                }
            }
            break;

        case STBIR__DECODE(STBIR_TYPE_FLOAT, STBIR_COLORSPACE_SRGB):
            for (x=0; x < num_pixels; ++x)
            {
                int pixel_index = x*channels;

                for (n = 0; n < num_nonalpha; n++)
                {
                    int index = pixel_index + nonalpha[n];
                    ((float*)output_buffer)[index] = stbir__linear_to_srgb(encode_buffer[index]);
                }

                if (!(stbir_info->flags&STBIR_FLAG_ALPHA_USES_COLORSPACE))
                    ((float*)output_buffer)[pixel_index + alpha_channel] = encode_buffer[pixel_index + alpha_channel];
            }
            break;

        default:
            STBIR_ASSERT(!"Unknown type/colorspace/channels combination.");
            break;
    }
}